

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

void __thiscall SQFunctionProto::~SQFunctionProto(SQFunctionProto *this)

{
  SQFunctionProto *in_RDI;
  
  ~SQFunctionProto(in_RDI);
  operator_delete(in_RDI,0xe8);
  return;
}

Assistant:

SQFunctionProto::~SQFunctionProto()
{
    REMOVE_FROM_CHAIN(&_ss(this)->_gc_chain,this);
}